

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O0

shared_ptr<kratos::Stmt> __thiscall kratos::Generator::get_stmt(Generator *this,uint32_t index)

{
  size_type sVar1;
  reference pvVar2;
  uint in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  shared_ptr<kratos::Stmt> sVar4;
  uint32_t index_local;
  Generator *this_local;
  
  sVar1 = std::
          vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
          size((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)(CONCAT44(in_register_00000034,index) + 0x1f8));
  if (in_EDX < sVar1) {
    pvVar2 = std::
             vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ::operator[]((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                           *)(CONCAT44(in_register_00000034,index) + 0x1f8),(ulong)in_EDX);
    std::shared_ptr<kratos::Stmt>::shared_ptr((shared_ptr<kratos::Stmt> *)this,pvVar2);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<kratos::Stmt>::shared_ptr((shared_ptr<kratos::Stmt> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Stmt>)
         sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> get_stmt(uint32_t index) {
        return index < stmts_.size() ? stmts_[index] : nullptr;
    }